

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::StandardLeastGreatest<true>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  string_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  pointer pVVar8;
  string_t *psVar9;
  VectorType vector_type_p;
  idx_t i;
  ulong uVar10;
  pointer pVVar11;
  idx_t col_idx;
  ulong uVar12;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar8 - (long)pVVar11 == 0x68) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar6);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  uVar12 = 0;
  while( true ) {
    if ((ulong)(((long)pVVar8 - (long)pVVar11) / 0x68) <= uVar12) break;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar12);
    if (pvVar6->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar12);
    StringVector::AddHeapReference(result,pvVar6);
    uVar12 = uVar12 + 1;
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  psVar2 = (string_t *)result->data;
  uVar12 = 0;
  switchD_016d4fed::default(result_has_value,0,0x800);
  do {
    if ((ulong)(((long)pVVar8 - (long)pVVar11) / 0x68) <= uVar12) {
      StandardLeastGreatest<true>::FinalizeResult(args->count,result_has_value,result,state);
      Vector::SetVectorType(result,vector_type_p);
      return;
    }
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar12);
    if (pvVar6->vector_type == CONSTANT_VECTOR) {
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar12);
      puVar3 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_01e0357d;
    }
    else {
LAB_01e0357d:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar12);
      Vector::ToUnifiedFormat(pvVar6,args->count,&vdata);
      pdVar4 = vdata.data;
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        psVar9 = psVar2;
        for (uVar10 = 0; uVar10 < args->count; uVar10 = uVar10 + 1) {
          uVar7 = uVar10;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)(vdata.sel)->sel_vector[uVar10];
          }
          pdVar1 = pdVar4 + uVar7 * 0x10;
          ivalue.value._0_8_ = *(undefined8 *)pdVar1;
          ivalue.value.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
          if (result_has_value[uVar10] == true) {
            bVar5 = string_t::StringComparisonOperators::GreaterThan(psVar9,&ivalue);
            if (bVar5) goto LAB_01e03689;
          }
          else {
LAB_01e03689:
            result_has_value[uVar10] = true;
            *(undefined8 *)&psVar9->value = ivalue.value._0_8_;
            (psVar9->value).pointer.ptr = ivalue.value.pointer.ptr;
          }
          psVar9 = psVar9 + 1;
        }
      }
      else {
        psVar9 = psVar2;
        for (uVar10 = 0; uVar10 < args->count; uVar10 = uVar10 + 1) {
          uVar7 = uVar10;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)(vdata.sel)->sel_vector[uVar10];
          }
          if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
               >> (uVar7 & 0x3f) & 1) != 0)) {
            pdVar1 = pdVar4 + uVar7 * 0x10;
            ivalue.value._0_8_ = *(undefined8 *)pdVar1;
            ivalue.value.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
            if (result_has_value[uVar10] == true) {
              bVar5 = string_t::StringComparisonOperators::GreaterThan(psVar9,&ivalue);
              if (!bVar5) goto LAB_01e03635;
            }
            result_has_value[uVar10] = true;
            *(undefined8 *)&psVar9->value = ivalue.value._0_8_;
            (psVar9->value).pointer.ptr = ivalue.value.pointer.ptr;
          }
LAB_01e03635:
          psVar9 = psVar9 + 1;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar12 = uVar12 + 1;
    pVVar11 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}